

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions.hpp
# Opt level: O0

void __thiscall
chaiscript::dispatch::
Proxy_Function_Callable_Impl<std::shared_ptr<unsigned_short>_(),_chaiscript::dispatch::detail::Constructor<unsigned_short>_>
::~Proxy_Function_Callable_Impl
          (Proxy_Function_Callable_Impl<std::shared_ptr<unsigned_short>_(),_chaiscript::dispatch::detail::Constructor<unsigned_short>_>
           *this)

{
  void *in_RDI;
  
  ~Proxy_Function_Callable_Impl
            ((Proxy_Function_Callable_Impl<std::shared_ptr<unsigned_short>_(),_chaiscript::dispatch::detail::Constructor<unsigned_short>_>
              *)0x3ad488);
  operator_delete(in_RDI,0x28);
  return;
}

Assistant:

virtual ~Proxy_Function_Callable_Impl() {}